

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O0

int connection_endpoint_get_incoming_channel(ENDPOINT_HANDLE endpoint,uint16_t *incoming_channel)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  uint16_t *incoming_channel_local;
  ENDPOINT_HANDLE endpoint_local;
  
  if ((endpoint == (ENDPOINT_HANDLE)0x0) || (incoming_channel == (uint16_t *)0x0)) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                ,"connection_endpoint_get_incoming_channel",0x7b4,1,
                "Bad arguments: endpoint = %p, incoming_channel = %p",endpoint,incoming_channel);
    }
    l._4_4_ = 0x7b5;
  }
  else {
    *incoming_channel = endpoint->incoming_channel;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int connection_endpoint_get_incoming_channel(ENDPOINT_HANDLE endpoint, uint16_t* incoming_channel)
{
    int result;

    if ((endpoint == NULL) ||
        (incoming_channel == NULL))
    {
        LogError("Bad arguments: endpoint = %p, incoming_channel = %p",
            endpoint, incoming_channel);
        result = MU_FAILURE;
    }
    else
    {
        *incoming_channel = endpoint->incoming_channel;
        result = 0;
    }

    return result;
}